

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedWriters.cpp
# Opt level: O0

int main(void)

{
  Severity SVar1;
  data_ref pacVar2;
  EventSource *eventSource;
  uint64_t _binlog_sid_v_1;
  SessionWriter writer2;
  uint64_t _binlog_sid_v;
  SessionWriter writer;
  Session session;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_3;
  memory_order __b_1;
  char (*in_stack_fffffffffffffa98) [25];
  __pthread_internal_list *p_Var3;
  EventSource *in_stack_fffffffffffffaa0;
  atomic<unsigned_long> *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab4;
  EventSource *in_stack_fffffffffffffac8;
  Session *in_stack_fffffffffffffad0;
  Session *this;
  string *in_stack_fffffffffffffae8;
  allocator *paVar4;
  SessionWriter *in_stack_fffffffffffffaf0;
  string *psVar5;
  Session *in_stack_fffffffffffffb10;
  string *in_stack_fffffffffffffb30;
  atomic<unsigned_long> *paVar6;
  undefined4 in_stack_fffffffffffffb38;
  undefined2 in_stack_fffffffffffffb3c;
  undefined2 in_stack_fffffffffffffb3e;
  size_t in_stack_fffffffffffffb40;
  Session *in_stack_fffffffffffffb48;
  SessionWriter *in_stack_fffffffffffffb50;
  SessionWriter *this_00;
  allocator *in_stack_fffffffffffffbd8;
  Session *in_stack_fffffffffffffbe0;
  allocator local_3b6;
  cx_string<0UL> local_3b5;
  allocator local_3b4;
  allocator local_3b3;
  allocator local_3b2;
  allocator local_3b1;
  undefined8 local_3b0;
  undefined2 local_3a8;
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  undefined8 local_340;
  string local_338 [32];
  undefined1 local_318 [48];
  string local_2e8 [32];
  undefined1 local_2c8 [86];
  undefined1 local_272;
  undefined1 local_271;
  undefined1 local_270;
  undefined1 local_26f;
  allocator local_26e;
  cx_string<0UL> local_26d;
  allocator local_26c;
  allocator local_26b;
  allocator local_26a;
  allocator local_269;
  undefined8 local_268;
  undefined2 local_260;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  undefined8 local_1f8;
  string local_1f0 [32];
  string local_1d0 [32];
  __atomic_base<unsigned_long> local_1b0;
  allocator local_1a1;
  string local_1a0 [48];
  string local_170 [32];
  SessionWriter local_150 [4];
  int local_74;
  __pthread_internal_list *local_70;
  memory_order local_68;
  int local_64;
  atomic<unsigned_long> *local_60;
  __atomic_base<unsigned_long> local_58;
  memory_order local_50;
  undefined4 local_4c;
  atomic<unsigned_long> *local_48;
  __pthread_internal_list *local_40;
  memory_order local_38;
  int local_34;
  __pthread_internal_list *local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_74 = 0;
  binlog::Session::Session(in_stack_fffffffffffffb10);
  std::__cxx11::string::string(local_170);
  binlog::SessionWriter::SessionWriter
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
             CONCAT26(in_stack_fffffffffffffb3e,
                      CONCAT24(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)),
             in_stack_fffffffffffffb30);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"w1",&local_1a1);
  binlog::SessionWriter::setName(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  binlog::SessionWriter::session(local_150);
  SVar1 = binlog::Session::minSeverity((Session *)0x1024c9);
  if (SVar1 < 0x81) {
    local_48 = &main::_binlog_sid;
    local_4c = 0;
    local_50 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_58 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_1b0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      in_stack_fffffffffffffbe0 = binlog::SessionWriter::session(local_150);
      local_268 = 0;
      local_260 = 0x80;
      in_stack_fffffffffffffbd8 = &local_269;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"main",in_stack_fffffffffffffbd8);
      local_272 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"main",&local_26a);
      local_271 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/NamedWriters.cpp"
                 ,&local_26b);
      local_270 = 1;
      local_1f8 = 0xc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"Hello named writer",&local_26c);
      local_26f = 1;
      local_26d = binlog::detail::concatenated_tags<char_const(&)[19]>
                            ((char (*) [19])in_stack_fffffffffffffa98);
      pacVar2 = mserialize::cx_string<0UL>::data(&local_26d);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,*pacVar2,&local_26e);
      local_26f = 0;
      local_270 = 0;
      local_271 = 0;
      local_272 = 0;
      local_1b0._M_i =
           binlog::Session::addEventSource(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffaa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_26e);
      std::allocator<char>::~allocator((allocator<char> *)&local_26c);
      std::allocator<char>::~allocator((allocator<char> *)&local_26b);
      std::allocator<char>::~allocator((allocator<char> *)&local_26a);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_1b0._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[19]>
              ((SessionWriter *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               (uint64_t)in_stack_fffffffffffffaa8,(uint64_t)in_stack_fffffffffffffaa0,
               (char (*) [19])in_stack_fffffffffffffa98);
  }
  this_00 = (SessionWriter *)local_2c8;
  std::__cxx11::string::string((string *)this_00);
  binlog::SessionWriter::SessionWriter
            (this_00,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
             CONCAT26(in_stack_fffffffffffffb3e,
                      CONCAT24(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)),
             in_stack_fffffffffffffb30);
  std::__cxx11::string::~string((string *)local_2c8);
  paVar4 = (allocator *)(local_318 + 0x2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"w2",paVar4);
  binlog::SessionWriter::setName(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)(local_318 + 0x2f));
  binlog::SessionWriter::session((SessionWriter *)(local_2c8 + 0x20));
  SVar1 = binlog::Session::minSeverity((Session *)0x102c17);
  if (SVar1 < 0x81) {
    local_60 = &main::_binlog_sid;
    local_64 = 0;
    paVar6 = &main::_binlog_sid;
    local_68 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_64 - 1U < 2) {
      local_70 = (__pthread_internal_list *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_64 == 5) {
      local_70 = (__pthread_internal_list *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_70 = (__pthread_internal_list *)(paVar6->super___atomic_base<unsigned_long>)._M_i;
    }
    local_318._32_8_ = local_70;
    if (local_70 == (__pthread_internal_list *)0x0) {
      binlog::SessionWriter::session((SessionWriter *)(local_2c8 + 0x20));
      local_3b0 = 0;
      local_3a8 = 0x80;
      psVar5 = local_3a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(psVar5,"main",&local_3b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"main",&local_3b2);
      psVar5 = local_360;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (psVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/NamedWriters.cpp"
                 ,&local_3b3);
      local_340 = 0x12;
      paVar4 = &local_3b4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_338,"Hello other named writer",paVar4);
      this = (Session *)local_318;
      local_3b5 = binlog::detail::concatenated_tags<char_const(&)[25]>(in_stack_fffffffffffffa98);
      eventSource = (EventSource *)mserialize::cx_string<0UL>::data(&local_3b5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,(char *)eventSource,&local_3b6);
      local_318._32_8_ = binlog::Session::addEventSource(this,eventSource);
      binlog::EventSource::~EventSource(in_stack_fffffffffffffaa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b6);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b4);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b3);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b2);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      local_28 = &main::_binlog_sid;
      local_30 = (__pthread_internal_list *)local_318._32_8_;
      local_34 = 5;
      in_stack_fffffffffffffaa8 = &main::_binlog_sid;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30;
      in_stack_fffffffffffffab4 = local_34;
      if (local_34 == 3) {
        (in_stack_fffffffffffffaa8->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_30;
      }
      else if (local_34 == 5) {
        LOCK();
        (in_stack_fffffffffffffaa8->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_30;
        UNLOCK();
      }
      else {
        (in_stack_fffffffffffffaa8->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_30;
      }
    }
    p_Var3 = (__pthread_internal_list *)local_318._32_8_;
    in_stack_fffffffffffffaa0 = (EventSource *)binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[25]>
              ((SessionWriter *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               (uint64_t)in_stack_fffffffffffffaa8,(uint64_t)in_stack_fffffffffffffaa0,
               (char (*) [25])p_Var3);
  }
  binlog::Session::consume<std::ostream>
            (in_stack_fffffffffffffbe0,
             (basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffbd8);
  local_74 = 0;
  binlog::SessionWriter::~SessionWriter((SessionWriter *)0x103255);
  binlog::SessionWriter::~SessionWriter((SessionWriter *)0x103262);
  binlog::Session::~Session((Session *)in_stack_fffffffffffffaa0);
  return local_74;
}

Assistant:

int main()
{
  binlog::Session session;
  binlog::SessionWriter writer(session);

  //[setName
  writer.setName("w1");
  BINLOG_INFO_W(writer, "Hello named writer");
  // Outputs: w1 Hello named writer
  //]

  binlog::SessionWriter writer2(session);
  writer2.setName("w2");
  BINLOG_INFO_W(writer2, "Hello other named writer");
  // Outputs: w2 Hello other named writer

  session.consume(std::cout);
  return 0;
}